

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O2

TString * LoadString(LoadState *S)

{
  size_t in_RAX;
  char *str;
  TString *pTVar1;
  size_t size;
  
  size = in_RAX;
  LoadBlock(S,&size,8);
  if (size == 0) {
    pTVar1 = (TString *)0x0;
  }
  else {
    str = luaZ_openspace(S->L,S->b,size);
    LoadBlock(S,str,size);
    pTVar1 = luaS_newlstr(S->L,str,size - 1);
  }
  return pTVar1;
}

Assistant:

static TString* LoadString(LoadState* S)
{
 size_t size;
 LoadVar(S,size);
 if (size==0)
  return NULL;
 else
 {
  char* s=luaZ_openspace(S->L,S->b,size);
  LoadBlock(S,s,size);
  return luaS_newlstr(S->L,s,size-1);		/* remove trailing '\0' */
 }
}